

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deThreadTest.c
# Opt level: O0

void consumerThread(void *arg)

{
  uint uVar1;
  int local_1c;
  deInt32 val;
  int readPos;
  TestBuffer *buffer;
  void *arg_local;
  
  local_1c = 0;
  do {
    deSemaphore_decrement(*(deSemaphore *)((long)arg + 0x88));
    uVar1 = *(uint *)((long)arg + (long)local_1c * 4);
    local_1c = (local_1c + 1) % 0x20;
    deSemaphore_increment(*(deSemaphore *)((long)arg + 0x80));
    *(uint *)((long)arg + 0x94) = uVar1 ^ *(uint *)((long)arg + 0x94);
  } while (uVar1 != 0);
  return;
}

Assistant:

void consumerThread (void* arg)
{
	TestBuffer*	buffer	= (TestBuffer*)arg;
	int			readPos	= 0;

	for (;;)
	{
		deInt32 val;

		deSemaphore_decrement(buffer->fill);

		val = buffer->buffer[readPos];
		readPos = (readPos + 1) % DE_LENGTH_OF_ARRAY(buffer->buffer);

		deSemaphore_increment(buffer->empty);

		buffer->consumerHash ^= val;

		if (val == 0)
			break;
	}
}